

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

vm_obj_id_t CVmObjDate::create(int in_root_set,int32_t dayno,int32_t daytime)

{
  vm_obj_id_t obj_id;
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  int32_t *piVar3;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  puVar2 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar2 = &PTR_get_metaclass_reg_003644e0;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,puVar2);
  piVar3 = (int32_t *)CONCAT44(extraout_var,iVar1);
  puVar2[1] = piVar3;
  *piVar3 = dayno;
  piVar3[1] = daytime;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjDate::create(VMG_ int in_root_set,
                               int32_t dayno, int32_t daytime)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);
    return id;
}